

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O3

int parg_reorder(int argc,char **argv,char *optstring,parg_option *longopts)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char **ppcVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  parg_state ps;
  int local_7c;
  parg_state local_70;
  char **local_58;
  int local_4c;
  parg_state local_48;
  
  if (argv == (char **)0x0) {
    __assert_fail("argv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",
                  0x142,"int parg_reorder(int, char **, const char *, const struct parg_option *)");
  }
  if (optstring == (char *)0x0) {
    __assert_fail("optstring != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",
                  0x143,"int parg_reorder(int, char **, const char *, const struct parg_option *)");
  }
  if (argc < 2) {
    return argc;
  }
  local_48.optarg = (char *)0x0;
  local_48.optind = 1;
  local_48.optopt = 0x3f;
  local_48.nextchar = (char *)0x0;
  iVar10 = 1;
  do {
    while( true ) {
      iVar7 = iVar10;
      iVar3 = parg_getopt_long(&local_48,argc,argv,optstring,longopts,(int *)0x0);
      iVar10 = local_48.optind;
      if ((iVar3 == 0x3a) || (iVar3 == 0x3f)) break;
      if (iVar3 == -1) goto LAB_0010a52c;
    }
  } while ((local_48.optind < argc) && (argv[local_48.optind] != (char *)0x0));
  iVar7 = local_48.optind + -1;
LAB_0010a52c:
  iVar10 = iVar7;
  if (1 < iVar7) {
    local_58 = argv + -1;
    local_4c = argc;
LAB_0010a54b:
    local_70.optarg = (char *)0x0;
    local_70.optind = 1;
    local_70.optopt = 0x3f;
    local_70.nextchar = (char *)0x0;
    do {
      iVar3 = parg_getopt_long(&local_70,iVar7,argv,optstring,longopts,(int *)0x0);
      if (local_70.nextchar == (char *)0x0) break;
    } while (*local_70.nextchar != '\0');
    bVar2 = false;
    iVar12 = 1;
LAB_0010a59e:
    local_7c = iVar12;
    iVar10 = local_7c;
    iVar11 = local_7c;
    if (iVar3 != -1) {
      if (iVar3 != 1) {
        local_7c = local_70.optind;
        do {
          iVar3 = parg_getopt_long(&local_70,iVar7,argv,optstring,longopts,(int *)0x0);
          iVar12 = local_7c;
          if (local_70.nextchar == (char *)0x0) break;
        } while (*local_70.nextchar != '\0');
        goto LAB_0010a59e;
      }
      do {
        iVar10 = local_70.optind;
        do {
          iVar3 = parg_getopt_long(&local_70,iVar7,argv,optstring,longopts,(int *)0x0);
          if (local_70.nextchar == (char *)0x0) break;
        } while (*local_70.nextchar != '\0');
        iVar11 = iVar10;
      } while (iVar3 == 1);
    }
LAB_0010a612:
    iVar12 = iVar10;
    if (iVar3 != -1) {
      if (iVar3 == 1) goto LAB_0010a648;
      iVar10 = local_70.optind;
      do {
        iVar3 = parg_getopt_long(&local_70,iVar7,argv,optstring,longopts,(int *)0x0);
        if (local_70.nextchar == (char *)0x0) break;
      } while (*local_70.nextchar != '\0');
      goto LAB_0010a612;
    }
    goto LAB_0010a687;
  }
LAB_0010a78a:
  if (iVar7 < argc) {
    if (1 < iVar7 - iVar10) {
      ppcVar6 = argv + iVar7;
      lVar4 = (long)iVar7 - (long)iVar10;
      lVar5 = (long)iVar10;
      do {
        ppcVar6 = ppcVar6 + -1;
        pcVar1 = argv[lVar5];
        argv[lVar5] = *ppcVar6;
        *ppcVar6 = pcVar1;
        lVar4 = lVar4 + -2;
        lVar5 = lVar5 + 1;
      } while (1 < lVar4);
    }
    iVar7 = iVar7 + 1;
    if (1 < iVar7 - iVar10) {
      ppcVar6 = argv + iVar7;
      lVar4 = (long)iVar7 - (long)iVar10;
      lVar5 = (long)iVar10;
      do {
        ppcVar6 = ppcVar6 + -1;
        pcVar1 = argv[lVar5];
        argv[lVar5] = *ppcVar6;
        *ppcVar6 = pcVar1;
        lVar4 = lVar4 + -2;
        lVar5 = lVar5 + 1;
      } while (1 < lVar4);
    }
    iVar10 = iVar10 + 1;
  }
  return iVar10;
LAB_0010a648:
  do {
    iVar12 = local_70.optind;
    do {
      iVar3 = parg_getopt_long(&local_70,iVar7,argv,optstring,longopts,(int *)0x0);
      if (local_70.nextchar == (char *)0x0) break;
    } while (*local_70.nextchar != '\0');
  } while (iVar3 == 1);
LAB_0010a687:
  if (iVar11 < iVar10) {
    lVar4 = (long)local_7c;
    lVar5 = (long)iVar11;
    if (1 < iVar11 - local_7c) {
      lVar8 = lVar5 - lVar4;
      ppcVar6 = local_58 + lVar5;
      lVar9 = lVar4;
      do {
        pcVar1 = argv[lVar9];
        argv[lVar9] = *ppcVar6;
        *ppcVar6 = pcVar1;
        lVar8 = lVar8 + -2;
        ppcVar6 = ppcVar6 + -1;
        lVar9 = lVar9 + 1;
      } while (1 < lVar8);
    }
    lVar9 = (long)iVar10;
    if (1 < iVar10 - iVar11) {
      lVar8 = lVar9 - lVar5;
      ppcVar6 = local_58 + lVar9;
      do {
        pcVar1 = argv[lVar5];
        argv[lVar5] = *ppcVar6;
        *ppcVar6 = pcVar1;
        lVar8 = lVar8 + -2;
        ppcVar6 = ppcVar6 + -1;
        lVar5 = lVar5 + 1;
      } while (1 < lVar8);
    }
    bVar2 = true;
    if (1 < iVar10 - local_7c) {
      ppcVar6 = local_58 + lVar9;
      lVar9 = lVar9 - lVar4;
      do {
        pcVar1 = argv[lVar4];
        argv[lVar4] = *ppcVar6;
        *ppcVar6 = pcVar1;
        lVar9 = lVar9 + -2;
        ppcVar6 = ppcVar6 + -1;
        lVar4 = lVar4 + 1;
      } while (1 < lVar9);
    }
  }
  if (iVar3 == -1) goto code_r0x0010a76b;
  goto LAB_0010a59e;
code_r0x0010a76b:
  if (!bVar2) goto code_r0x0010a776;
  goto LAB_0010a54b;
code_r0x0010a776:
  iVar10 = (local_7c - iVar11) + iVar10;
  argc = local_4c;
  goto LAB_0010a78a;
}

Assistant:

int
parg_reorder(int argc, char *argv[],
             const char *optstring,
             const struct parg_option *longopts)
{
	struct parg_state ps;
	int lastind;
	int optend;
	int c;

	assert(argv != NULL);
	assert(optstring != NULL);

	if (argc < 2) {
		return argc;
	}

	parg_init(&ps);

	/* Find end of normal arguments */
	do {
		lastind = ps.optind;

		c = parg_getopt_long(&ps, argc, argv, optstring, longopts, NULL);

		/* Check for trailing option with error */
		if ((c == '?' || c == ':') && is_argv_end(&ps, argc, argv)) {
			lastind = ps.optind - 1;
			break;
		}
	} while (c != -1);

	optend = parg_reorder_simple(lastind, argv, optstring, longopts);

	/* Rotate `--` or trailing option with error into position */
	if (lastind < argc) {
		reverse(argv, optend, lastind);
		reverse(argv, optend, lastind + 1);
		++optend;
	}

	return optend;
}